

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void rollback_all_test(bool multi_kv)

{
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  uint64_t *in_stack_00000aa8;
  fdb_snapshot_info_t **in_stack_00000ab0;
  fdb_file_handle *in_stack_00000ab8;
  void *pvVar5;
  fdb_kvs_handle *in_stack_fffffffffffff948;
  fdb_file_handle *in_stack_fffffffffffff950;
  fdb_snapshot_info_t *in_stack_fffffffffffff958;
  size_t *in_stack_fffffffffffff968;
  void **in_stack_fffffffffffff970;
  size_t in_stack_fffffffffffff978;
  void *in_stack_fffffffffffff980;
  fdb_kvs_handle *in_stack_fffffffffffff988;
  fdb_doc *pfStack_620;
  undefined1 *apuStack_618 [5];
  char *local_5f0;
  size_t local_5e8;
  char *local_5e0;
  size_t local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  size_t local_5b8;
  char *local_5b0;
  size_t local_5a8;
  char *local_5a0;
  int local_594;
  undefined1 *local_590;
  char *local_588;
  size_t local_580;
  char *local_578;
  size_t local_570;
  char *local_568;
  int local_55c;
  undefined1 *local_558;
  fdb_kvs_info *in_stack_fffffffffffffab0;
  fdb_kvs_handle *in_stack_fffffffffffffab8;
  size_t local_520;
  size_t bodylen;
  char *body;
  fdb_kvs_handle *dbhandle;
  fdb_file_handle *fhandle;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char kv_name [8];
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_status local_dc;
  long lStack_d8;
  fdb_status status;
  uint64_t num_markers;
  fdb_seqnum_t rollback_seq;
  fdb_snapshot_info_t *markers;
  fdb_kvs_info info;
  fdb_doc **doc;
  fdb_kvs_handle **db;
  fdb_file_handle *dbfile;
  int num_kvs;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  bool multi_kv_local;
  
  apuStack_618[3] = (undefined1 *)0x11e3c0;
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  apuStack_618[3] = (undefined1 *)0x11e3cd;
  memleak_start();
  dbfile._0_4_ = 4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.compactor_sleep_duration._0_1_ = multi_kv;
  fconfig.encryption_key.bytes[0x1c] = '\0';
  fconfig.encryption_key.bytes[0x1d] = '\0';
  fconfig.encryption_key.bytes[0x1e] = '\0';
  fconfig.encryption_key.bytes[0x1f] = '\0';
  fconfig._180_4_ = 0;
  fdb_open((fdb_file_handle **)fconfig.compaction_cb,(char *)fconfig._80_8_,
           (fdb_config *)fconfig.prefetch_duration);
  if (multi_kv) {
    for (num_kvs = 0; num_kvs < 4; num_kvs = num_kvs + 1) {
      sprintf((char *)&fconfig.num_blocks_readahead,"kv%d",(ulong)(uint)num_kvs);
      fdb_kvs_open((fdb_file_handle *)kvs_config._0_8_,&fhandle->root,(char *)dbhandle,
                   (fdb_kvs_config *)body);
    }
  }
  else {
    dbfile._0_4_ = 1;
    fdb_kvs_open_default
              (in_stack_fffffffffffff950,(fdb_kvs_handle **)in_stack_fffffffffffff948,
               (fdb_kvs_config *)0x11e50e);
  }
  num_kvs = 0;
  do {
    if ((int)dbfile <= num_kvs) {
      for (n = 0; n < 5; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        local_558 = &stack0xfffffffffffff948 + (long)n * 8;
        in_stack_fffffffffffffab0 = (fdb_kvs_info *)(metabuf + 0xf8);
        in_stack_fffffffffffffab8 = (fdb_kvs_handle *)strlen(metabuf + 0xf8);
        strlen(bodybuf + 0xf8);
        pvVar5 = (void *)0x11e6a1;
        sVar3 = strlen(kv_name);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                       (size_t)in_stack_fffffffffffff948,pvVar5,sVar3,(void *)0x11e6d8,
                       (size_t)in_stack_fffffffffffff970);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set((fdb_kvs_handle *)apuStack_618[num_kvs],
                  *(fdb_doc **)(&stack0xfffffffffffff948 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff948,'\0');
      for (; local_55c = n, n < 10; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        local_590 = &stack0xfffffffffffff948 + (long)n * 8;
        local_588 = metabuf + 0xf8;
        local_580 = strlen(metabuf + 0xf8);
        local_578 = bodybuf + 0xf8;
        local_570 = strlen(bodybuf + 0xf8);
        local_568 = kv_name;
        pvVar5 = (void *)0x11e815;
        sVar3 = strlen(kv_name);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                       (size_t)in_stack_fffffffffffff948,pvVar5,sVar3,(void *)0x11e84c,
                       (size_t)in_stack_fffffffffffff970);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set((fdb_kvs_handle *)apuStack_618[num_kvs],
                  *(fdb_doc **)(&stack0xfffffffffffff948 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff948,'\0');
      for (; local_594 = n, n < 0xf; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        local_5c8 = &stack0xfffffffffffff948 + (long)n * 8;
        local_5c0 = metabuf + 0xf8;
        local_5b8 = strlen(metabuf + 0xf8);
        local_5b0 = bodybuf + 0xf8;
        local_5a8 = strlen(bodybuf + 0xf8);
        local_5a0 = kv_name;
        pvVar5 = (void *)0x11e995;
        sVar3 = strlen(kv_name);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                       (size_t)in_stack_fffffffffffff948,pvVar5,sVar3,(void *)0x11e9cc,
                       (size_t)in_stack_fffffffffffff970);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set((fdb_kvs_handle *)apuStack_618[num_kvs],
                  *(fdb_doc **)(&stack0xfffffffffffff948 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff948,'\0');
      for (; n < 0x14; n = n + 1) {
        sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
        sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
        sprintf(kv_name,"body%d",(ulong)(uint)n);
        apuStack_618[4] = &stack0xfffffffffffff948 + (long)n * 8;
        local_5f0 = metabuf + 0xf8;
        local_5e8 = strlen(metabuf + 0xf8);
        local_5e0 = bodybuf + 0xf8;
        local_5d8 = strlen(bodybuf + 0xf8);
        local_5d0 = kv_name;
        pvVar5 = (void *)0x11eaf1;
        sVar3 = strlen(kv_name);
        fdb_doc_create((fdb_doc **)in_stack_fffffffffffff958,in_stack_fffffffffffff950,
                       (size_t)in_stack_fffffffffffff948,pvVar5,sVar3,(void *)0x11eb28,
                       (size_t)in_stack_fffffffffffff970);
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_set((fdb_kvs_handle *)apuStack_618[num_kvs],
                  *(fdb_doc **)(&stack0xfffffffffffff948 + (long)n * 8));
        }
      }
      fdb_commit((fdb_file_handle *)in_stack_fffffffffffff948,'\0');
      fVar1 = fdb_get_all_snap_markers(in_stack_00000ab8,in_stack_00000ab0,in_stack_00000aa8);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x120d);
        rollback_all_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x120d,"void rollback_all_test(bool)");
        }
      }
      if (multi_kv) {
        if (lStack_d8 != 8) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x120f);
          rollback_all_test::__test_pass = 0;
          if (lStack_d8 != 8) {
            __assert_fail("num_markers == 8",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x120f,"void rollback_all_test(bool)");
          }
        }
      }
      else if (lStack_d8 != 4) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1211);
        rollback_all_test::__test_pass = 0;
        if (lStack_d8 != 4) {
          __assert_fail("num_markers == 4",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1211,"void rollback_all_test(bool)");
        }
      }
      local_dc = fdb_rollback_all((fdb_file_handle *)metabuf._152_8_,metabuf._144_8_);
      if (multi_kv) {
        if (local_dc != FDB_RESULT_KV_STORE_BUSY) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x121c);
          rollback_all_test::__test_pass = 0;
          if (local_dc != FDB_RESULT_KV_STORE_BUSY) {
            __assert_fail("status == FDB_RESULT_KV_STORE_BUSY",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x121c,"void rollback_all_test(bool)");
          }
        }
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          fdb_kvs_close(in_stack_fffffffffffff948);
        }
        fVar1 = fdb_open((fdb_file_handle **)fconfig.compaction_cb,(char *)fconfig._80_8_,
                         (fdb_config *)fconfig.prefetch_duration);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1225);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1225,"void rollback_all_test(bool)");
          }
        }
        fVar1 = fdb_kvs_open((fdb_file_handle *)kvs_config._0_8_,&fhandle->root,(char *)dbhandle,
                             (fdb_kvs_config *)body);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1227);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1227,"void rollback_all_test(bool)");
          }
        }
        fVar1 = fdb_rollback_all((fdb_file_handle *)metabuf._152_8_,metabuf._144_8_);
        if (fVar1 != FDB_RESULT_KV_STORE_BUSY) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x122a);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_KV_STORE_BUSY) {
            __assert_fail("status == FDB_RESULT_KV_STORE_BUSY",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x122a,"void rollback_all_test(bool)");
          }
        }
        fVar1 = fdb_kvs_close(in_stack_fffffffffffff948);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x122d);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x122d,"void rollback_all_test(bool)");
          }
        }
        fVar1 = fdb_close((fdb_file_handle *)in_stack_fffffffffffff948);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x122f);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x122f,"void rollback_all_test(bool)");
          }
        }
        local_dc = fdb_rollback_all((fdb_file_handle *)metabuf._152_8_,metabuf._144_8_);
      }
      if (local_dc != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1234);
        rollback_all_test::__test_pass = 0;
        if (local_dc != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1234,"void rollback_all_test(bool)");
        }
      }
      if (multi_kv) {
        for (num_kvs = 0; num_kvs < (int)dbfile; num_kvs = num_kvs + 1) {
          sprintf((char *)&fconfig.num_blocks_readahead,"kv%d",(ulong)(uint)num_kvs);
          fVar1 = fdb_kvs_open((fdb_file_handle *)kvs_config._0_8_,&fhandle->root,(char *)dbhandle,
                               (fdb_kvs_config *)body);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x123a);
            rollback_all_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x123a,"void rollback_all_test(bool)");
            }
          }
          fVar1 = fdb_set_log_callback
                            ((fdb_kvs_handle *)apuStack_618[num_kvs],logCallbackFunc,
                             "rollback_all_test");
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x123d);
            rollback_all_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x123d,"void rollback_all_test(bool)");
            }
          }
        }
      }
      num_kvs = 0;
      while( true ) {
        if ((int)dbfile <= num_kvs) {
          num_kvs = 0;
          do {
            if ((int)dbfile <= num_kvs) {
              fVar1 = fdb_commit((fdb_file_handle *)in_stack_fffffffffffff948,'\0');
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1257);
                rollback_all_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                ,0x1257,"void rollback_all_test(bool)");
                }
              }
              fdb_close((fdb_file_handle *)in_stack_fffffffffffff948);
              for (n = 0; n < 0x14; n = n + 1) {
                fdb_doc_free((fdb_doc *)0x11f6a1);
              }
              fVar1 = fdb_free_snap_markers
                                (in_stack_fffffffffffff958,(uint64_t)in_stack_fffffffffffff950);
              if (fVar1 != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1262);
                rollback_all_test::__test_pass = 0;
                if (fVar1 != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                ,0x1262,"void rollback_all_test(bool)");
                }
              }
              fdb_shutdown();
              memleak_end();
              pcVar4 = "single kv mode:";
              if (multi_kv) {
                pcVar4 = "multiple kv mode:";
              }
              sprintf(kv_name,"rollback all test %s",pcVar4);
              if (rollback_all_test::__test_pass == 0) {
                fprintf(_stderr,"%s FAILED\n",kv_name);
              }
              else {
                fprintf(_stderr,"%s PASSED\n",kv_name);
              }
              return;
            }
            fVar1 = fdb_set((fdb_kvs_handle *)apuStack_618[num_kvs],
                            (fdb_doc *)in_stack_fffffffffffff948);
            if (fVar1 != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1254);
              rollback_all_test::__test_pass = 0;
              if (fVar1 != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0x1254,"void rollback_all_test(bool)");
              }
            }
            num_kvs = num_kvs + 1;
          } while( true );
        }
        fVar1 = fdb_get_kvs_info(in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1245);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1245,"void rollback_all_test(bool)");
          }
        }
        if (info.name != (char *)0xf) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1246);
          rollback_all_test::__test_pass = 0;
          if (info.name != (char *)0xf) {
            __assert_fail("info.last_seqnum == rollback_seq",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1246,"void rollback_all_test(bool)");
          }
        }
        if (info.last_seqnum != 0xf) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1247);
          rollback_all_test::__test_pass = 0;
          if (info.last_seqnum != 0xf) {
            __assert_fail("info.doc_count == rollback_seq",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1247,"void rollback_all_test(bool)");
          }
        }
        fVar1 = fdb_get((fdb_kvs_handle *)apuStack_618[num_kvs],pfStack_620);
        if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1249);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) {
            __assert_fail("status == FDB_RESULT_KEY_NOT_FOUND",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1249,"void rollback_all_test(bool)");
          }
        }
        fVar1 = fdb_get_kv(in_stack_fffffffffffff988,in_stack_fffffffffffff980,
                           in_stack_fffffffffffff978,in_stack_fffffffffffff970,
                           in_stack_fffffffffffff968);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x124c);
          rollback_all_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x124c,"void rollback_all_test(bool)");
          }
        }
        iVar2 = memcmp((in_stack_fffffffffffff948->field_6).seqtree,(void *)bodylen,local_520);
        if (iVar2 != 0) break;
        free((void *)bodylen);
        num_kvs = num_kvs + 1;
      }
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",bodylen,
              (in_stack_fffffffffffff948->field_6).seqtree,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x124d);
      rollback_all_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x124d,"void rollback_all_test(bool)");
    }
    fVar1 = fdb_set_log_callback
                      ((fdb_kvs_handle *)apuStack_618[num_kvs],logCallbackFunc,"rollback_all_test");
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x11ce);
      rollback_all_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x11ce,"void rollback_all_test(bool)");
      }
    }
    num_kvs = num_kvs + 1;
  } while( true );
}

Assistant:

void rollback_all_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_snapshot_info_t *markers;
    fdb_seqnum_t rollback_seq;
    uint64_t num_markers;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous dummy files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;
    fconfig.block_reusing_threshold = 0;

    fdb_open(&dbfile, "./mvcc_test6", &fconfig);
    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_all_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    if (multi_kv) {
        TEST_CHK(num_markers == 8);
    } else {
        TEST_CHK(num_markers == 4);
    }

    // rollback to 15
    i = 1;
    rollback_seq = (fdb_seqnum_t)(n - (i*5));
    status = fdb_rollback_all(dbfile, markers[i].marker);
    if (multi_kv) {
        // In multi-kv mode, we cannot rollback all instances,
        // without closing them first, since a rollback point
        // may end up invalidating open handles
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);

        for (r = 0; r < num_kvs; ++r) {
            fdb_kvs_close(db[r]);
        }

        fdb_file_handle *fhandle;
        fdb_kvs_handle *dbhandle;
        status = fdb_open(&fhandle, "./mvcc_test6", &fconfig);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_kvs_open(fhandle, &dbhandle, "kv0", &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        // Rollback again, but should fail again because there is a new handle created
        status = fdb_rollback_all(dbfile, markers[i].marker);
        TEST_CHK(status == FDB_RESULT_KV_STORE_BUSY);
        // Close the handle to have the rollback pass
        status = fdb_kvs_close(dbhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_close(fhandle);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        status = fdb_rollback_all(dbfile, markers[i].marker);
    }

    TEST_CHK(status == FDB_RESULT_SUCCESS);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            status = fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_set_log_callback(db[r], logCallbackFunc,
                    (void *) "rollback_all_test");
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    for (r = 0; r < num_kvs; ++r) {
        char *body;
        size_t bodylen;
        status = fdb_get_kvs_info(db[r], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == rollback_seq);
        TEST_CHK(info.doc_count == rollback_seq);
        status = fdb_get(db[r], doc[n - 1]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_get_kv(db[r], doc[0]->key, doc[0]->keylen,
                            (void **)&body, &bodylen);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(doc[0]->body, body, bodylen);
        free(body);
    }

    // test normal operation after rollbacks manually flush WAL & commit
    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set(db[r], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback all test %s", multi_kv ? "multiple kv mode:"
                                                      : "single kv mode:");
    TEST_RESULT(bodybuf);
}